

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

void __thiscall fasttext::FastText::train(FastText *this,Args *args,TrainCallback *callback)

{
  bool bVar1;
  byte bVar2;
  element_type *peVar3;
  invalid_argument *piVar4;
  ulong uVar5;
  shared_ptr<fasttext::Matrix> *in_RDI;
  bool normalizeGradient;
  shared_ptr<fasttext::Loss> loss;
  ifstream ifs;
  string *in_stack_00000140;
  FastText *in_stack_00000148;
  shared_ptr<fasttext::Args> *in_stack_fffffffffffffce8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcf0;
  bool *__args_3;
  undefined7 in_stack_fffffffffffffd18;
  undefined1 in_stack_fffffffffffffd1f;
  shared_ptr<fasttext::Matrix> *in_stack_fffffffffffffd20;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_fffffffffffffd38;
  FastText *in_stack_fffffffffffffd48;
  undefined7 in_stack_fffffffffffffd88;
  undefined1 in_stack_fffffffffffffd8f;
  Dictionary *in_stack_fffffffffffffd90;
  bool local_250 [16];
  shared_ptr<fasttext::Matrix> *in_stack_fffffffffffffdc0;
  FastText *in_stack_fffffffffffffdc8;
  TrainCallback *in_stack_fffffffffffffdd8;
  FastText *in_stack_fffffffffffffde0;
  
  std::make_shared<fasttext::Args,fasttext::Args_const&>
            ((Args *)CONCAT17(in_stack_fffffffffffffd1f,in_stack_fffffffffffffd18));
  std::shared_ptr<fasttext::Args>::operator=
            ((shared_ptr<fasttext::Args> *)in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  std::shared_ptr<fasttext::Args>::~shared_ptr((shared_ptr<fasttext::Args> *)0x1c2bf0);
  std::make_shared<fasttext::Dictionary,std::shared_ptr<fasttext::Args>&>
            ((shared_ptr<fasttext::Args> *)
             CONCAT17(in_stack_fffffffffffffd1f,in_stack_fffffffffffffd18));
  std::shared_ptr<fasttext::Dictionary>::operator=
            ((shared_ptr<fasttext::Dictionary> *)in_stack_fffffffffffffcf0,
             (shared_ptr<fasttext::Dictionary> *)in_stack_fffffffffffffce8);
  std::shared_ptr<fasttext::Dictionary>::~shared_ptr((shared_ptr<fasttext::Dictionary> *)0x1c2c25);
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1c2c2f);
  bVar1 = std::operator==(in_stack_fffffffffffffcf0,(char *)in_stack_fffffffffffffce8);
  if (bVar1) {
    piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar4,"Cannot use stdin for training!");
    __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  peVar3 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1c2cb0);
  __args_3 = local_250;
  std::ifstream::ifstream(__args_3,(string *)&peVar3->input,_S_in);
  bVar2 = std::ifstream::is_open();
  if ((bVar2 & 1) == 0) {
    piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1c2d0d);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(bVar2,in_stack_fffffffffffffd18),__args_3);
    std::invalid_argument::invalid_argument(piVar4,(string *)&stack0xfffffffffffffd90);
    __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1c2ddc);
  Dictionary::readFromFile
            (in_stack_fffffffffffffd90,
             (istream *)CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88));
  std::ifstream::close();
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1c2e07);
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1c2e24);
    getInputMatrixFromFile(in_stack_00000148,in_stack_00000140);
    std::shared_ptr<fasttext::Matrix>::operator=
              ((shared_ptr<fasttext::Matrix> *)in_stack_fffffffffffffcf0,
               (shared_ptr<fasttext::Matrix> *)in_stack_fffffffffffffce8);
    std::shared_ptr<fasttext::Matrix>::~shared_ptr((shared_ptr<fasttext::Matrix> *)0x1c2e65);
  }
  else {
    createRandomMatrix(in_stack_fffffffffffffd48);
    std::shared_ptr<fasttext::Matrix>::operator=
              ((shared_ptr<fasttext::Matrix> *)in_stack_fffffffffffffcf0,
               (shared_ptr<fasttext::Matrix> *)in_stack_fffffffffffffce8);
    std::shared_ptr<fasttext::Matrix>::~shared_ptr((shared_ptr<fasttext::Matrix> *)0x1c2e9e);
  }
  createTrainOutputMatrix((FastText *)in_stack_fffffffffffffd38._M_pi);
  std::shared_ptr<fasttext::Matrix>::operator=
            ((shared_ptr<fasttext::Matrix> *)in_stack_fffffffffffffcf0,
             (shared_ptr<fasttext::Matrix> *)in_stack_fffffffffffffce8);
  std::shared_ptr<fasttext::Matrix>::~shared_ptr((shared_ptr<fasttext::Matrix> *)0x1c2ed6);
  *(undefined1 *)
   &in_RDI[6].super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = 0
  ;
  createLoss(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1c2efa);
  std::
  make_shared<fasttext::Model,std::shared_ptr<fasttext::Matrix>&,std::shared_ptr<fasttext::Matrix>&,std::shared_ptr<fasttext::Loss>&,bool&>
            (in_RDI,in_stack_fffffffffffffd20,
             (shared_ptr<fasttext::Loss> *)CONCAT17(bVar2,in_stack_fffffffffffffd18),__args_3);
  std::shared_ptr<fasttext::Model>::operator=
            ((shared_ptr<fasttext::Model> *)&stack0xfffffffffffffd30,
             (shared_ptr<fasttext::Model> *)in_stack_fffffffffffffce8);
  std::shared_ptr<fasttext::Model>::~shared_ptr((shared_ptr<fasttext::Model> *)0x1c2f50);
  startThreads(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  std::shared_ptr<fasttext::Loss>::~shared_ptr((shared_ptr<fasttext::Loss> *)0x1c2f6e);
  std::ifstream::~ifstream(local_250);
  return;
}

Assistant:

void FastText::train(const Args& args, const TrainCallback& callback) {
  args_ = std::make_shared<Args>(args);
  dict_ = std::make_shared<Dictionary>(args_);
  if (args_->input == "-") {
    // manage expectations
    throw std::invalid_argument("Cannot use stdin for training!");
  }
  std::ifstream ifs(args_->input);
  if (!ifs.is_open()) {
    throw std::invalid_argument(
        args_->input + " cannot be opened for training!");
  }
  dict_->readFromFile(ifs);
  ifs.close();

  if (!args_->pretrainedVectors.empty()) {
    input_ = getInputMatrixFromFile(args_->pretrainedVectors);
  } else {
    input_ = createRandomMatrix();
  }
  output_ = createTrainOutputMatrix();
  quant_ = false;
  auto loss = createLoss(output_);
  bool normalizeGradient = (args_->model == model_name::sup);
  model_ = std::make_shared<Model>(input_, output_, loss, normalizeGradient);
  startThreads(callback);
}